

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

QSet<QSpanCollection::Span_*> __thiscall
QSpanCollection::spansInRect(QSpanCollection *this,int x,int y,int w,int h)

{
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *this_00;
  long lVar1;
  QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
  *pQVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  const_iterator cVar8;
  undefined4 in_register_00000034;
  int in_R9D;
  long in_FS_OFFSET;
  Span *s;
  _Base_ptr local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->spans).super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  this_00 = (QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
            (CONCAT44(in_register_00000034,x) + 0x18);
  local_40 = (_Base_ptr)CONCAT44(local_40._4_4_,-w);
  cVar3._M_node =
       (_Base_ptr)
       QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::lowerBound(this_00,(int *)&local_40);
  lVar1 = *(long *)(CONCAT44(in_register_00000034,x) + 0x18);
  cVar8._M_node = (_Base_ptr)(lVar1 + 0x10);
  if (lVar1 == 0) {
    cVar8._M_node = (_Base_ptr)0x0;
  }
  if (cVar3._M_node == cVar8._M_node) {
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_decrement(cVar3._M_node);
  }
  while (SBORROW4(in_R9D + w,-cVar3._M_node[1]._M_color) ==
         (int)(in_R9D + w + cVar3._M_node[1]._M_color) < 0) {
    local_40 = (_Base_ptr)CONCAT44(local_40._4_4_,-y);
    cVar4._M_node =
         (_Base_ptr)
         QMap<int,_QSpanCollection::Span_*>::lowerBound
                   ((QMap<int,_QSpanCollection::Span_*> *)&cVar3._M_node[1]._M_parent,
                    (int *)&local_40);
    p_Var7 = cVar3._M_node[1]._M_parent;
    cVar5._M_node = (_Base_ptr)&p_Var7->_M_left;
    if (p_Var7 == (_Base_ptr)0x0) {
      cVar5._M_node = (_Base_ptr)0x0;
    }
    if (cVar4._M_node != cVar5._M_node) goto LAB_0052719e;
    do {
      cVar4._M_node = (_Base_ptr)std::_Rb_tree_decrement(cVar4._M_node);
LAB_0052719e:
      if (SBORROW4(h + y,-cVar4._M_node[1]._M_color) != (int)(h + y + cVar4._M_node[1]._M_color) < 0
         ) break;
      local_40 = cVar4._M_node[1]._M_parent;
      if ((w <= *(int *)&local_40->_M_parent) && (y <= *(int *)((long)&local_40->_M_parent + 4))) {
        QSet<QSpanCollection::Span_*>::operator<<
                  ((QSet<QSpanCollection::Span_*> *)this,(Span **)&local_40);
        p_Var7 = cVar3._M_node[1]._M_parent;
      }
      if (p_Var7 == (_Base_ptr)0x0) {
        p_Var6 = (_Base_ptr)0x0;
      }
      else {
        p_Var6 = *(_Base_ptr *)(p_Var7 + 1);
      }
    } while (cVar4._M_node != p_Var6);
    pQVar2 = (this_00->d).d.ptr;
    if (pQVar2 == (QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
                   *)0x0) {
      p_Var7 = (_Base_ptr)0x0;
    }
    else {
      p_Var7 = *(_Base_ptr *)
                ((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    if (cVar3._M_node == p_Var7) break;
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_decrement(cVar3._M_node);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSet<QSpanCollection::Span_*>)(Hash)this;
  }
  __stack_chk_fail();
}

Assistant:

QSet<QSpanCollection::Span *> QSpanCollection::spansInRect(int x, int y, int w, int h) const
{
    QSet<Span *> list;
    Index::const_iterator it_y = index.lowerBound(-y);
    if (it_y == index.end())
        --it_y;
    while(-it_y.key() <= y + h) {
        SubIndex::const_iterator it_x = (*it_y).lowerBound(-x);
        if (it_x == (*it_y).end())
            --it_x;
        while(-it_x.key() <= x + w) {
            Span *s = *it_x;
            if (s->bottom() >= y && s->right() >= x)
                list << s;
            if (it_x == (*it_y).begin())
                break;
            --it_x;
        }
        if (it_y == index.begin())
            break;
        --it_y;
    }
    return list;
}